

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Performance::ShaderCompilerLightCase::init
          (ShaderCompilerLightCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  Texture2D *this_00;
  EVP_PKEY_CTX *ctx_00;
  TextureFormatInfo fmtInfo;
  TextureFormatInfo local_60;
  long lVar2;
  
  iVar1 = (*((this->super_ShaderCompilerCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,((this->super_ShaderCompilerCase).super_TestCase.m_context)->m_renderCtx,0x1907
             ,0x1401,0x40,0x40);
  this->m_texture = this_00;
  tcu::getTextureFormatInfo(&local_60,(TextureFormat *)&this_00->m_refTexture);
  tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,0);
  tcu::fillWithComponentGradients
            ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_60.valueMin,&local_60.valueMax);
  (**(code **)(lVar2 + 8))(0x84c0);
  (**(code **)(lVar2 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar2 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar2 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar2 + 0x1360))(0xde1,0x2802,0x812f);
  ctx_00 = (EVP_PKEY_CTX *)0x2803;
  (**(code **)(lVar2 + 0x1360))(0xde1,0x2803,0x812f);
  (*this->m_texture->_vptr_Texture2D[2])();
  iVar1 = ShaderCompilerCase::init(&this->super_ShaderCompilerCase,ctx_00);
  return iVar1;
}

Assistant:

void ShaderCompilerLightCase::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Setup texture.

	DE_ASSERT(m_texture == DE_NULL);

	m_texture = new glu::Texture2D(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, TEXTURE_WIDTH, TEXTURE_HEIGHT);

	tcu::TextureFormatInfo fmtInfo = tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());

	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(0), fmtInfo.valueMin, fmtInfo.valueMax);

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	m_texture->upload();

	ShaderCompilerCase::init();
}